

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall tinyusdz::Stage::replace_root_prim(Stage *this,string *prim_name,Prim *prim)

{
  string *p;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_t i;
  ulong uVar6;
  Stage *pSVar7;
  Prim *pPVar8;
  Prim *this_01;
  Prim *pPVar9;
  int iVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar12;
  long lVar13;
  pointer pPVar14;
  Prim *__args;
  long lVar15;
  ostringstream ss_e;
  allocator local_229;
  Stage *local_228;
  Prim *local_220;
  string *local_218;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_210;
  string local_208;
  string local_1e8;
  string local_1c8 [32];
  Path local_1a8;
  
  if (prim_name->_M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,699);
    ::std::operator<<(poVar5," ");
    ::std::__cxx11::string::string((string *)&local_1e8,"prim_name is empty.",&local_229);
    fmt::format(&local_208,&local_1e8);
    poVar5 = ::std::operator<<((ostream *)&local_1a8,(string *)&local_208);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    psVar12 = (string *)&this->_err;
  }
  else {
    bVar1 = ValidatePrimElementName(prim_name);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2bf);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"`{}` is not a valid Prim name.",&local_229);
      fmt::format<std::__cxx11::string>
                ((string *)&local_208,(fmt *)&local_1e8,(string *)prim_name,in_RCX);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,(string *)&local_208);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00281830;
    }
    pPVar14 = (this->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar8 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = ((long)pPVar8 - (long)pPVar14) / 0x350;
    local_210 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->_root_node_nameSet;
    local_228 = this;
    local_220 = prim;
    local_218 = prim_name;
    if (uVar3 != (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210);
      lVar13 = 0x1a0;
      uVar6 = 0;
      pSVar7 = local_228;
      while( true ) {
        this_00 = local_210;
        pPVar14 = (pSVar7->_root_nodes).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar8 = (pSVar7->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar3 = ((long)pPVar8 - (long)pPVar14) / 0x350;
        if (uVar3 <= uVar6) break;
        if (*(long *)((long)&(pPVar14->_abs_path)._prim_part + lVar13 + 8) == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2c7);
          ::std::operator<<(poVar5," ");
          pcVar11 = "Internal error: Existing root Prim\'s elementName is empty.";
          goto LAB_002817e5;
        }
        sVar4 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_210,(key_type *)((long)&(pPVar14->_abs_path)._prim_part + lVar13));
        pSVar7 = local_228;
        if (sVar4 != 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2cb);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)&local_1a8,
                                     "Internal error: Stage contains root Prim with same elementName."
                                    );
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          psVar12 = (string *)&pSVar7->_err;
          goto LAB_0028181d;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_equal<std::__cxx11::string_const&>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((local_228->_root_nodes).
                                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                   _prim_part + lVar13));
        uVar6 = uVar6 + 1;
        lVar13 = lVar13 + 0x350;
      }
    }
    ::std::__cxx11::string::string(local_1c8,(string *)local_218);
    ::std::__cxx11::string::string((string *)&local_1e8,local_1c8);
    ::std::__cxx11::string::string((string *)&local_1a8,(string *)&local_1e8);
    ::std::__cxx11::string::string((string *)&local_208,(string *)&local_1a8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_1a8,(string *)&local_208);
    lVar13 = 0;
    for (lVar15 = (long)uVar3 >> 2; __args = local_220,
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pPVar14->_elementPath)._prim_part + lVar13), 0 < lVar15;
        lVar15 = lVar15 + -1) {
      _Var2 = ::std::operator==(__lhs,&local_1a8._prim_part);
      if (_Var2) {
        this_01 = (Prim *)((long)&(pPVar14->_abs_path)._prim_part + lVar13);
        __args = local_220;
        goto LAB_002815c6;
      }
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&pPVar14[1]._elementPath._prim_part + lVar13),
                                &local_1a8._prim_part);
      if (_Var2) {
        this_01 = (Prim *)((long)&pPVar14[1]._abs_path._prim_part + lVar13);
        __args = local_220;
        goto LAB_002815c6;
      }
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&pPVar14[2]._elementPath._prim_part + lVar13),
                                &local_1a8._prim_part);
      if (_Var2) {
        this_01 = (Prim *)((long)&pPVar14[2]._abs_path._prim_part + lVar13);
        __args = local_220;
        goto LAB_002815c6;
      }
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&pPVar14[3]._elementPath._prim_part + lVar13),
                                &local_1a8._prim_part);
      if (_Var2) {
        this_01 = (Prim *)((long)&pPVar14[3]._abs_path._prim_part + lVar13);
        __args = local_220;
        goto LAB_002815c6;
      }
      lVar13 = lVar13 + 0xd40;
    }
    lVar15 = ((long)pPVar8 + (-lVar13 - (long)pPVar14)) / 0x350;
    pPVar9 = (Prim *)((long)&(pPVar14->_abs_path)._prim_part + lVar13);
    if (lVar15 == 1) {
LAB_00281893:
      _Var2 = ::std::operator==(&(pPVar9->_elementPath)._prim_part,&local_1a8._prim_part);
      this_01 = pPVar9;
      if (!_Var2) {
        this_01 = pPVar8;
      }
    }
    else if (lVar15 == 3) {
      _Var2 = ::std::operator==(__lhs,&local_1a8._prim_part);
      this_01 = pPVar9;
      if (!_Var2) {
        pPVar9 = (Prim *)((long)&pPVar14[1]._abs_path._prim_part + lVar13);
        goto LAB_00281869;
      }
    }
    else {
      this_01 = pPVar8;
      if (lVar15 == 2) {
LAB_00281869:
        _Var2 = ::std::operator==(&(pPVar9->_elementPath)._prim_part,&local_1a8._prim_part);
        this_01 = pPVar9;
        if (!_Var2) {
          pPVar9 = pPVar9 + 1;
          goto LAB_00281893;
        }
      }
    }
LAB_002815c6:
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    p = local_218;
    pPVar8 = (local_228->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = SetPrimElementName(&__args->_data,local_218);
    if (this_01 == pPVar8) {
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_208,"",(allocator *)&local_1e8);
        Path::Path(&local_1a8,p,&local_208);
        Path::operator=(&__args->_elementPath,&local_1a8);
        Path::~Path(&local_1a8);
        ::std::__cxx11::string::_M_dispose();
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_equal<std::__cxx11::string_const&>(local_210,p);
        pSVar7 = local_228;
        ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                  (&local_228->_root_nodes,__args);
        goto LAB_002816f4;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      iVar10 = 0x2e5;
    }
    else {
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_208,"",(allocator *)&local_1e8);
        Path::Path(&local_1a8,p,&local_208);
        Path::operator=(&__args->_elementPath,&local_1a8);
        Path::~Path(&local_1a8);
        ::std::__cxx11::string::_M_dispose();
        Prim::operator=(this_01,__args);
        pSVar7 = local_228;
LAB_002816f4:
        pSVar7->_dirty = true;
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"replace_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      iVar10 = 0x2db;
    }
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,iVar10);
    ::std::operator<<(poVar5," ");
    pcVar11 = "Internal error. cannot modify Prim\'s elementName.";
LAB_002817e5:
    poVar5 = ::std::operator<<((ostream *)&local_1a8,pcVar11);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::stringbuf::str();
    psVar12 = (string *)&local_228->_err;
  }
LAB_0028181d:
  ::std::__cxx11::string::append(psVar12);
  ::std::__cxx11::string::_M_dispose();
LAB_00281830:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return false;
}

Assistant:

bool Stage::replace_root_prim(const std::string &prim_name, Prim &&prim) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (prim_name.empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format("prim_name is empty."));
  }

  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN(fmt::format("`{}` is not a valid Prim name.", prim_name));
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_root_nodes.begin(), _root_nodes.end(), [prim_name](const Prim &p) {
    return (p.element_name() == prim_name);
  });

  if (result != _root_nodes.end()) {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    (*result) = std::move(prim); // replace

  } else {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    _root_node_nameSet.insert(prim_name);
    _root_nodes.emplace_back(std::move(prim)); // add
  }

  _dirty = true;

  return true;
}